

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
               *this,GetterYs<long_long> *getter1,GetterYRef *getter2,TransformerLogLin *transformer
              ,ImU32 col)

{
  ImVec2 IVar1;
  int iVar2;
  long lVar3;
  ImPlotPlot *pIVar4;
  GetterYRef *pGVar5;
  TransformerLogLin *pTVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar13 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar13 = iVar2;
  }
  this->Prims = iVar13 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar12 = GImPlot;
  (this->P12).y = 0.0;
  lVar3 = *(long *)((long)getter1->Ys +
                   (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride);
  dVar9 = log10((getter1->XScale * 0.0 + getter1->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar12->CurrentPlot;
  dVar10 = (pIVar4->XAxis).Range.Min;
  iVar2 = transformer->YAxis;
  IVar1 = pIVar12->PixelRange[iVar2].Min;
  IVar7.y = (float)(pIVar12->My[iVar2] * ((double)lVar3 - pIVar4->YAxis[iVar2].Range.Min) +
                   (double)IVar1.y);
  IVar7.x = (float)(pIVar12->Mx *
                    (((double)(float)(dVar9 / pIVar12->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar10) + dVar10) - dVar10) + (double)IVar1.x);
  this->P11 = IVar7;
  pIVar12 = GImPlot;
  pGVar5 = this->Getter2;
  pTVar6 = this->Transformer;
  dVar9 = pGVar5->YRef;
  dVar10 = log10((pGVar5->XScale * 0.0 + pGVar5->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar4 = pIVar12->CurrentPlot;
  dVar11 = (pIVar4->XAxis).Range.Min;
  iVar2 = pTVar6->YAxis;
  IVar1 = pIVar12->PixelRange[iVar2].Min;
  IVar8.y = (float)(pIVar12->My[iVar2] * (dVar9 - pIVar4->YAxis[iVar2].Range.Min) + (double)IVar1.y)
  ;
  IVar8.x = (float)(pIVar12->Mx *
                    (((double)(float)(dVar10 / pIVar12->LogDenX) *
                      ((pIVar4->XAxis).Range.Max - dVar11) + dVar11) - dVar11) + (double)IVar1.x);
  this->P12 = IVar8;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }